

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O1

int __thiscall ModuleWriter::verifyAndWriteModule(ModuleWriter *this)

{
  Module *pMVar1;
  char cVar2;
  bool bVar3;
  raw_ostream *prVar4;
  size_t sVar5;
  char *pcVar6;
  StringRef Str;
  StringRef Str_00;
  
  pMVar1 = this->M;
  prVar4 = (raw_ostream *)llvm::errs();
  cVar2 = llvm::verifyModule(pMVar1,prVar4,(bool *)0x0);
  if (cVar2 == '\0') {
    bVar3 = writeModule(this);
    if (bVar3) {
      return 0;
    }
    prVar4 = (raw_ostream *)llvm::errs();
    pcVar6 = "Saving sliced module failed\n";
    sVar5 = 0x1c;
  }
  else {
    prVar4 = (raw_ostream *)llvm::errs();
    Str.Length = 0x42;
    Str.Data = "[llvm-slicer] ERROR: Verifying module failed, the IR is not valid\n";
    llvm::raw_ostream::operator<<(prVar4,Str);
    prVar4 = (raw_ostream *)llvm::errs();
    pcVar6 = "[llvm-slicer] Saving anyway so that you can check it\n";
    sVar5 = 0x35;
  }
  Str_00.Length = sVar5;
  Str_00.Data = pcVar6;
  llvm::raw_ostream::operator<<(prVar4,Str_00);
  return 1;
}

Assistant:

int verifyAndWriteModule() {
        if (!verifyModule()) {
            llvm::errs() << "[llvm-slicer] ERROR: Verifying module failed, the "
                            "IR is not valid\n";
            llvm::errs()
                    << "[llvm-slicer] Saving anyway so that you can check it\n";
            return 1;
        }

        if (!writeModule()) {
            llvm::errs() << "Saving sliced module failed\n";
            return 1;
        }

        // exit code
        return 0;
    }